

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O2

Move * move_dup(Move *move)

{
  Move *pMVar1;
  MovePack *pMVar2;
  
  pMVar1 = move_create(move->type,move->fromSpotType,move->fromSpotIndex,move->fromSpotCardIndex,
                       move->toSpotType,move->toSpotIndex,move->toSpotCardIndex);
  if (move->movePack != (MovePack *)0x0) {
    pMVar2 = movePack_dup(move->movePack);
    pMVar1->movePack = pMVar2;
  }
  return pMVar1;
}

Assistant:

Move * move_dup(Move * move)
{
	Move * dupMove = move_create(move->type, move->fromSpotType, move->fromSpotIndex, move->fromSpotCardIndex, move->toSpotType, move->toSpotIndex, move->toSpotCardIndex);
	if(move->movePack!=0)
		dupMove->movePack = movePack_dup(move->movePack);
	return dupMove;
}